

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
::Naive_vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
          (Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
           *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *nonZeroRowIndices,
          Column_settings *colSettings)

{
  ID_index IVar1;
  pointer puVar2;
  pointer puVar3;
  ID_index *pIVar4;
  reference value;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
  *this_00;
  int iVar5;
  ID_index *pIVar6;
  size_type __n;
  ulong uVar7;
  allocator_type local_45;
  ID_index local_44;
  Naive_vector_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
  *local_40;
  value_type local_38;
  
  *(undefined4 *)this = 0xffffffff;
  uVar7 = 0;
  *(undefined8 *)(this + 8) = 0;
  puVar2 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  __n = (long)puVar2 - (long)puVar3 >> 2;
  iVar5 = (int)__n + -1;
  if (puVar2 == puVar3) {
    iVar5 = 0;
  }
  *(int *)(this + 0x10) = iVar5;
  local_40 = this + 0x18;
  local_38 = (value_type)0x0;
  std::
  vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
  ::vector((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
            *)local_40,__n,&local_38,&local_45);
  *(undefined8 *)(this + 0x30) = 0;
  *(Column_settings **)(this + 0x38) = colSettings;
  pIVar4 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = (nonZeroRowIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                ._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar4; pIVar6 = pIVar6 + 1) {
    IVar1 = *pIVar6;
    value = (reference)operator_new(0x20);
    (value->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
    (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (value->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
    value->rowIndex_ = IVar1;
    *(reference *)(*(long *)(this + 0x18) + uVar7 * 8) = value;
    local_44 = IVar1;
    if (*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
          **)(this + 8) !=
        (map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
         *)0x0) {
      this_00 = &std::
                 map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                 ::operator[](*(map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                                **)(this + 8),&local_44)->super_type;
      boost::intrusive::
      list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)2,_Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag,_1U>,_unsigned_long,_false,_void>
      ::push_back(this_00,value);
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  return;
}

Assistant:

inline Naive_vector_column<Master_matrix,Support>::Naive_vector_column(const Container& nonZeroRowIndices,
                                                               Column_settings* colSettings)
    : RA_opt(),
      Dim_opt(nonZeroRowIndices.size() == 0 ? 0 : nonZeroRowIndices.size() - 1),
      Chain_opt(),
      column_(nonZeroRowIndices.size(), nullptr),
      operators_(nullptr),
      entryPool_(&(colSettings->entryConstructor))
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Constructor not available for chain columns, please specify the dimension of the chain.");

  Index i = 0;
  if constexpr (Master_matrix::Option_list::is_z2) {
    for (ID_index id : nonZeroRowIndices) {
      _update_entry(id, i++);
    }
  } else {
    operators_ = &(colSettings->operators);
    for (const auto& p : nonZeroRowIndices) {
      _update_entry(operators_->get_value(p.second), p.first, i++);
    }
  }
}